

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactTriangleXYZ::ContactForceLoadQ
          (ChContactTriangleXYZ *this,ChVector<double> *F,ChVector<double> *point,ChState *state_x,
          ChVectorDynamic<> *Q,int offset)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  char *__function;
  ulong uVar5;
  bool is_into;
  double s3;
  double s2;
  ChVector<double> p_projected;
  ChVector<double> A2;
  ChVector<double> A1;
  ChVector<double> A3;
  
  p_projected.m_data[0] =
       (double)(state_x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  p_projected.m_data[1] = 1.48219693752374e-323;
  if (2 < (state_x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    uVar4 = (ulong)(uint)offset;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&A1,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&p_projected,(type *)0x0);
    p_projected.m_data[0] =
         (double)((state_x->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 3);
    p_projected.m_data[1] = 1.48219693752374e-323;
    if (5 < (state_x->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&A2,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&p_projected,(type *)0x0);
      p_projected.m_data[0] =
           (double)((state_x->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + 6);
      p_projected.m_data[1] = 1.48219693752374e-323;
      if (8 < (state_x->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&A3,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&p_projected,(type *)0x0);
        p_projected.m_data[0] = 0.0;
        p_projected.m_data[1] = 0.0;
        p_projected.m_data[2] = 0.0;
        collision::utils::PointTriangleDistance(point,&A1,&A2,&A3,&s2,&s3,&is_into,&p_projected);
        if ((-1 < offset) &&
           ((long)offset <=
            (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
            -3)) {
          pdVar2 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + offset;
          uVar3 = 3;
          if ((((ulong)pdVar2 & 7) == 0) &&
             (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
            uVar3 = uVar5;
          }
          dVar1 = (1.0 - s2) - s3;
          if (uVar3 != 0) {
            uVar5 = 0;
            do {
              pdVar2[uVar5] = dVar1 * F->m_data[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar3 != uVar5);
          }
          if (uVar3 < 3) {
            do {
              pdVar2[uVar3] = dVar1 * F->m_data[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar3 != 3);
          }
          if ((long)(uVar4 + 3) <=
              (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
              -3) {
            pdVar2 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data + uVar4 + 3;
            uVar3 = 3;
            if ((((ulong)pdVar2 & 7) == 0) &&
               (uVar5 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
              uVar3 = uVar5;
            }
            if (uVar3 != 0) {
              uVar5 = 0;
              do {
                pdVar2[uVar5] = s2 * F->m_data[uVar5];
                uVar5 = uVar5 + 1;
              } while (uVar3 != uVar5);
            }
            if (uVar3 < 3) {
              do {
                pdVar2[uVar3] = s2 * F->m_data[uVar3];
                uVar3 = uVar3 + 1;
              } while (uVar3 != 3);
            }
            if ((long)(uVar4 + 6) <=
                (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                + -3) {
              pdVar2 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data + uVar4 + 6;
              uVar4 = 3;
              if ((((ulong)pdVar2 & 7) == 0) &&
                 (uVar3 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
                uVar4 = uVar3;
              }
              if (uVar4 != 0) {
                uVar3 = 0;
                do {
                  pdVar2[uVar3] = s3 * F->m_data[uVar3];
                  uVar3 = uVar3 + 1;
                } while (uVar4 != uVar3);
              }
              if (uVar4 < 3) {
                do {
                  pdVar2[uVar4] = s3 * F->m_data[uVar4];
                  uVar4 = uVar4 + 1;
                } while (uVar4 != 3);
              }
              return;
            }
          }
        }
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_0063a915;
      }
    }
  }
  p_projected.m_data[1] = 1.48219693752374e-323;
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0063a915:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChContactTriangleXYZ::ContactForceLoadQ(const ChVector<>& F,
                                             const ChVector<>& point,
                                             const ChState& state_x,
                                             ChVectorDynamic<>& Q,
                                             int offset) {
    // Calculate barycentric coordinates
    ChVector<> A1(state_x.segment(0, 3));
    ChVector<> A2(state_x.segment(3, 3));
    ChVector<> A3(state_x.segment(6, 3));

    double s2, s3;
    bool is_into;
    ChVector<> p_projected;
    /*double dist =*/collision::utils::PointTriangleDistance(point, A1, A2, A3, s2, s3, is_into, p_projected);
    double s1 = 1 - s2 - s3;
    Q.segment(offset + 0, 3) = F.eigen() * s1;
    Q.segment(offset + 3, 3) = F.eigen() * s2;
    Q.segment(offset + 6, 3) = F.eigen() * s3;
}